

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O0

void __thiscall
st_tree::detail::
node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
::~node_base(node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
             *this)

{
  iterator this_00;
  bool bVar1;
  reference ppnVar2;
  __normal_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_**,_std::vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
  local_80;
  __normal_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_**,_std::vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
  local_78;
  iterator e;
  tree_type *tree_;
  iterator local_60;
  undefined1 local_48 [8];
  iterator j;
  vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
  d;
  node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
  *this_local;
  
  this->_vptr_node_base = (_func_int **)&PTR__node_base_004723e0;
  bVar1 = std::
          multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
          ::empty(&this->_children);
  if ((!bVar1) && (bVar1 = _default_constructed(this), !bVar1)) {
    std::
    vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
    ::vector((vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
              *)&j.field_0x10);
    begin((iterator *)local_48,this);
    while( true ) {
      end(&local_60,this);
      bVar1 = valmap_iterator_adaptor_forward<std::_Rb_tree_const_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::dref_vmap<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
              ::operator!=((valmap_iterator_adaptor_forward<std::_Rb_tree_const_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::dref_vmap<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
                            *)local_48,&local_60);
      valmap_iterator_adaptor_forward<std::_Rb_tree_const_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::dref_vmap<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
      ::~valmap_iterator_adaptor_forward(&local_60);
      if (!bVar1) break;
      tree_ = (tree_type *)
              valmap_iterator_adaptor_forward<std::_Rb_tree_const_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::dref_vmap<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
              ::operator*((valmap_iterator_adaptor_forward<std::_Rb_tree_const_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::dref_vmap<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
                           *)local_48);
      std::
      vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
      ::push_back((vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
                   *)&j.field_0x10,(value_type *)&tree_);
      valmap_iterator_adaptor_forward<std::_Rb_tree_const_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::dref_vmap<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
      ::operator++((valmap_iterator_adaptor_forward<std::_Rb_tree_const_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::dref_vmap<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
                    *)local_48);
    }
    valmap_iterator_adaptor_forward<std::_Rb_tree_const_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::dref_vmap<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
    ::~valmap_iterator_adaptor_forward
              ((valmap_iterator_adaptor_forward<std::_Rb_tree_const_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>,_st_tree::detail::dref_vmap<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
                *)local_48);
    std::
    multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
    ::clear(&this->_children);
    e._M_current = (node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
                    **)tree(this);
    local_78._M_current =
         (node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
          **)std::
             vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
             ::begin((vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
                      *)&j.field_0x10);
    while( true ) {
      local_80._M_current =
           (node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
            **)std::
               vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
               ::end((vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
                      *)&j.field_0x10);
      bVar1 = __gnu_cxx::operator!=(&local_78,&local_80);
      this_00 = e;
      if (!bVar1) break;
      ppnVar2 = __gnu_cxx::
                __normal_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_**,_std::vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
                ::operator*(&local_78);
      tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>::_delete_node
                ((tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_> *)
                 this_00._M_current,*ppnVar2);
      __gnu_cxx::
      __normal_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_**,_std::vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
      ::operator++(&local_78);
    }
    std::
    vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
    ::~vector((vector<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
               *)&j.field_0x10);
  }
  max_maintainer<unsigned_long,_std::allocator<str1>_>::~max_maintainer(&this->_depth);
  std::
  multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
  ::~multiset(&this->_children);
  ut_ordered::emplace_subnodes::test_method::str1::~str1(&this->_data);
  return;
}

Assistant:

virtual ~node_base() {
        // Saves work, and also prevents exception attempting to call tree() on default-constructed nodes
        if (_children.empty() || _default_constructed()) return;
        // Save off child pointers, take down the child container, and then deallocate children
        vector<node_type*> d;
        for (iterator j(begin());  j != end();  ++j)  d.push_back(&*j);
        _children.clear();
        tree_type& tree_ = this->tree();
        for (typename vector<node_type*>::iterator e(d.begin());  e != d.end();  ++e)  tree_._delete_node(*e);
    }